

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsResub.c
# Opt level: O1

int Abc_NtkMfsResubNode2(Mfs_Man_t *p,Abc_Obj_t *pNode)

{
  void *pvVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  
  if ((1 < (pNode->vFanins).nSize) && (0 < (pNode->vFanins).nSize)) {
    lVar5 = 0;
    do {
      pvVar1 = pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar5]];
      uVar3 = *(uint *)((long)pvVar1 + 0x14) & 0xf;
      if ((((uVar3 != 2) && (uVar3 != 5)) && (*(int *)((long)pvVar1 + 0x2c) == 1)) &&
         (0 < (pNode->vFanins).nSize)) {
        lVar4 = 0;
        do {
          if ((lVar5 != lVar4) &&
             (iVar2 = Abc_NtkMfsSolveSatResub2(p,pNode,(int)lVar5,(int)lVar4), iVar2 != 0)) {
            return 1;
          }
          lVar4 = lVar4 + 1;
        } while ((int)lVar4 < (pNode->vFanins).nSize);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < (pNode->vFanins).nSize);
  }
  return 0;
}

Assistant:

int Abc_NtkMfsResubNode2( Mfs_Man_t * p, Abc_Obj_t * pNode )
{
    Abc_Obj_t * pFanin, * pFanin2;
    int i, k;
/*
    Abc_ObjForEachFanin( pNode, pFanin, i )
        if ( !Abc_ObjIsCi(pFanin) && Abc_ObjFanoutNum(pFanin) == 1 )
        {
            if ( Abc_NtkMfsSolveSatResub( p, pNode, i, 0, 0 ) )
                return 1;
        }
*/
    if ( Abc_ObjFaninNum(pNode) < 2 )
        return 0;
    // try replacing one area critical fanin and one other fanin while adding two new fanins
    Abc_ObjForEachFanin( pNode, pFanin, i )
    {
        if ( !Abc_ObjIsCi(pFanin) && Abc_ObjFanoutNum(pFanin) == 1 )
        {
            // consider second fanin to remove at the same time
            Abc_ObjForEachFanin( pNode, pFanin2, k )
            {
                if ( i != k && Abc_NtkMfsSolveSatResub2( p, pNode, i, k ) )
                    return 1;
            }
        }
    }
    return 0;
}